

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O0

double xc_bessel_K1(double x)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double unaff_retaddr;
  double r;
  double local_10;
  
  local_10 = 0.0;
  if (0.0 < in_XMM0_Qa) {
    if (4.450147717014403e-308 <= in_XMM0_Qa) {
      if (2.0 < in_XMM0_Qa) {
        local_10 = exp(-in_XMM0_Qa);
        dVar1 = xc_bessel_K1_scaled(unaff_retaddr);
        local_10 = local_10 * dVar1;
      }
      else {
        dVar1 = log(in_XMM0_Qa * 0.5);
        dVar2 = xc_bessel_I1(unaff_retaddr);
        dVar3 = xc_cheb_eval(in_XMM0_Qa * 0.5 * in_XMM0_Qa + -1.0,bk1_data,0xb);
        local_10 = dVar1 * dVar2 + (dVar3 + 0.75) / in_XMM0_Qa;
      }
    }
    else {
      fprintf(_stderr,"Overflow error in bessel_K1\n");
    }
  }
  else {
    fprintf(_stderr,"Domain error in bessel_K1\n");
  }
  return local_10;
}

Assistant:

GPU_FUNCTION
double xc_bessel_K1(const double x)
{
  double r = 0.0;

  if(x <= 0.0) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Domain error in bessel_K1\n");
#endif
  } else if(x<2.0*DBL_MIN) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Overflow error in bessel_K1\n");
#endif
  }
  else if(x <= 2.0)
    r = log(0.5*x)*xc_bessel_I1(x) + (0.75 + xc_cheb_eval(0.5*x*x - 1.0, bk1_data, 11))/x;
  else
    r = exp(-x)*xc_bessel_K1_scaled(x);

  return r;
}